

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O3

Literal __thiscall Clasp::PBBuilder::addProduct(PBBuilder *this,LitVec *lits)

{
  PKey *this_00;
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  mapped_type *pmVar4;
  
  bVar1 = SharedContext::ok((this->super_ProgramBuilder).ctx_);
  uVar3 = 2;
  if (bVar1) {
    this_00 = &this->prod_;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::reserve
              (&this_00->lits,(lits->ebo_).size + 1);
    bVar1 = productSubsumed(this,lits,this_00);
    if (bVar1) {
      uVar3 = ((lits->ebo_).buf)->rep_;
    }
    else {
      pmVar4 = std::__detail::
               _Map_base<Clasp::PBBuilder::PKey,_std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>,_std::__detail::_Select1st,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Clasp::PBBuilder::PKey,_std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>,_std::__detail::_Select1st,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)((this->products_).ptr_ & 0xfffffffffffffffe),this_00);
      uVar3 = pmVar4->rep_;
      if (uVar3 < 2) {
        uVar2 = getAuxVar(this);
        pmVar4->rep_ = uVar2 * 4;
        addProductConstraints(this,(Literal)(uVar2 * 4),lits);
        uVar3 = pmVar4->rep_;
      }
    }
  }
  return (Literal)uVar3;
}

Assistant:

Literal PBBuilder::addProduct(LitVec& lits) {
	if (!ctx()->ok()) { return lit_false(); }
	prod_.lits.reserve(lits.size() + 1);
	if (productSubsumed(lits, prod_)){
		return lits[0];
	}
	Literal& eq = (*products_)[prod_];
	if (eq != lit_true()) {
		return eq;
	}
	eq = posLit(getAuxVar());
	addProductConstraints(eq, lits);
	return eq;
}